

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

EitherFlag * __thiscall
args::Matcher::GetShortOrAny(EitherFlag *__return_storage_ptr__,Matcher *this)

{
  char cVar1;
  
  if ((this->shortFlags)._M_h._M_element_count == 0) {
    if ((this->longFlags)._M_h._M_element_count != 0) {
      EitherFlag::EitherFlag
                (__return_storage_ptr__,
                 (string *)((this->longFlags)._M_h._M_before_begin._M_nxt + 1));
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->isShort = true;
    __return_storage_ptr__->shortFlag = ' ';
  }
  else {
    cVar1 = *(char *)&(this->shortFlags)._M_h._M_before_begin._M_nxt[1]._M_nxt;
    __return_storage_ptr__->isShort = true;
    __return_storage_ptr__->shortFlag = cVar1;
  }
  (__return_storage_ptr__->longFlag)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->longFlag).field_2;
  (__return_storage_ptr__->longFlag)._M_string_length = 0;
  (__return_storage_ptr__->longFlag).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

EitherFlag GetShortOrAny() const
            {
                if (!shortFlags.empty())
                {
                    return *shortFlags.begin();
                }

                if (!longFlags.empty())
                {
                    return *longFlags.begin();
                }

                // should be unreachable
                return ' ';
            }